

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plaHash.c
# Opt level: O2

Vec_Int_t * Pla_ManComputeDistance1Int(Pla_Man_t *p)

{
  Vec_Wec_t *p_00;
  Tab_Obj_t *pTVar1;
  int i_00;
  int iVar2;
  int iVar3;
  uint i_01;
  uint i_02;
  int iVar;
  int iVar_00;
  int iVar4;
  Vec_Int_t *p_01;
  Vec_Int_t *p_02;
  Vec_Int_t *p_03;
  Vec_Int_t *p_04;
  Vec_Int_t *p_05;
  Vec_Int_t *pVVar5;
  Tab_Man_t *pTab;
  long lVar6;
  Vec_Int_t *vCube;
  int iVar7;
  int Addition;
  int Addition_00;
  int i;
  int iVar8;
  uint uVar9;
  uint uVar10;
  int iVar11;
  int iVar12;
  int Counter;
  uint uVar13;
  Tab_Obj_t *pTVar14;
  int i_03;
  
  p_01 = Vec_IntAlloc(100);
  p_02 = Vec_IntAlloc(100);
  p_03 = Vec_IntAlloc(1000);
  p_00 = &p->vCubeLits;
  uVar10 = (p->vCubeLits).nSize;
  p_04 = Vec_IntAlloc(uVar10);
  p_04->nSize = uVar10;
  memset(p_04->pArray,0,(long)(int)uVar10 << 2);
  p_05 = Vec_IntAlloc(p->nIns);
  uVar13 = 0;
  for (iVar8 = 0; iVar8 < (p->vCubeLits).nSize; iVar8 = iVar8 + 1) {
    pVVar5 = Vec_WecEntry(p_00,iVar8);
    uVar13 = uVar13 + pVVar5->nSize;
  }
  iVar8 = Abc_Base2Log(uVar13);
  if (iVar8 < 0x19) {
    pTab = Tab_ManAlloc(iVar8 + 2,p);
    Pla_ManHashCubes2(p,pTab);
    uVar13 = pTab->SizeMask;
    for (uVar9 = 0; (int)uVar9 <= (int)uVar13; uVar9 = uVar9 + 1) {
      pTVar1 = pTab->pBins;
      pTVar14 = pTVar1 + (uVar13 & uVar9);
      p_05->nSize = 0;
      while ((lVar6 = (long)pTVar14->Table, lVar6 != 0 && (pTVar1 != (Tab_Obj_t *)0x0))) {
        pTVar14 = (Tab_Obj_t *)&pTVar1[lVar6].Next;
        Vec_IntPushTwo(p_05,pTVar1[lVar6].Cube,(uint)*(ushort *)&pTVar1[lVar6].field_0xc);
      }
      iVar3 = p_05->nSize / 2;
      iVar11 = 0;
      iVar8 = 0;
      if (0 < iVar3) {
        iVar8 = iVar3;
      }
      iVar7 = 3;
      while (iVar11 != iVar8) {
        i_00 = iVar11 * 2;
        iVar2 = iVar11 * 2;
        iVar11 = iVar11 + 1;
        i_03 = iVar7;
        for (iVar12 = iVar11; iVar12 < iVar3; iVar12 = iVar12 + 1) {
          i_01 = Vec_IntEntry(p_05,i_00);
          i_02 = Vec_IntEntry(p_05,i_03 + -1);
          iVar = Vec_IntEntry(p_05,iVar2 + 1);
          iVar_00 = Vec_IntEntry(p_05,i_03);
          pVVar5 = Vec_WecEntry(p_00,i_01);
          vCube = Vec_WecEntry(p_00,i_02);
          if (pVVar5->nSize == vCube->nSize) {
            Vec_IntCopySkip(pVVar5,iVar,p_01);
            Vec_IntCopySkip(vCube,iVar_00,p_02);
            iVar4 = Vec_IntEqual(p_01,p_02);
            if (iVar4 != 0) {
              printf("%d %d  ",(ulong)i_01,(ulong)i_02);
              Vec_IntPushTwo(p_03,i_01,iVar);
              Vec_IntPushTwo(p_03,i_02,iVar_00);
              Vec_IntAddToEntry(p_04,i_01,Addition);
              Vec_IntAddToEntry(p_04,i_02,Addition_00);
            }
          }
          i_03 = i_03 + 2;
        }
        iVar7 = iVar7 + 2;
      }
    }
    printf("Vector has %d entries: {",(ulong)uVar10);
    uVar13 = 0;
    if (0 < (int)uVar10) {
      uVar13 = uVar10;
    }
    for (uVar10 = 0; uVar13 != uVar10; uVar10 = uVar10 + 1) {
      uVar9 = Vec_IntEntry(p_04,uVar10);
      printf(" %d",(ulong)uVar9);
    }
    puts(" }");
    Vec_IntFree(p_04);
    Vec_IntFree(p_01);
    Vec_IntFree(p_02);
    Vec_IntFree(p_05);
    Tab_ManFree(pTab);
    return p_03;
  }
  __assert_fail("nBits <= 26",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/pla/plaHash.c"
                ,0x115,"Vec_Int_t *Pla_ManComputeDistance1Int(Pla_Man_t *)");
}

Assistant:

Vec_Int_t * Pla_ManComputeDistance1Int( Pla_Man_t * p )
{
    Tab_Man_t * pTab;
    Vec_Int_t * vCube1, * vCube2;
    Vec_Int_t * vTemp1 = Vec_IntAlloc( 100 );
    Vec_Int_t * vTemp2 = Vec_IntAlloc( 100 );
    Vec_Int_t * vPairs = Vec_IntAlloc( 1000 );
    Vec_Int_t * vCounts = Vec_IntStart( Vec_WecSize(&p->vCubeLits) );
    Vec_Int_t * vEntries = Vec_IntAlloc( p->nIns );
    int nBits = Abc_Base2Log( Vec_WecSizeSize(&p->vCubeLits) ) + 2;
    int v, i, k;//, Count = 0;
    int iCube1, iCube2, iVar1, iVar2;
    assert( nBits <= 26 );
    pTab = Tab_ManAlloc( nBits, p );
    //Pla_ManConvertFromBits( p );
    Pla_ManHashCubes2( p, pTab );
    // iterate through the hash bins
    for ( v = 0; v <= pTab->SizeMask; v++ )
    {
        Tab_ManHashCollect( pTab, v, vEntries );
        for ( i = 0; i < Vec_IntSize(vEntries)/2; i++ )
        for ( k = i+1; k < Vec_IntSize(vEntries)/2; k++ )
        {
            iCube1 = Vec_IntEntry(vEntries, 2*i);
            iCube2 = Vec_IntEntry(vEntries, 2*k);
            iVar1 = Vec_IntEntry(vEntries, 2*i+1);
            iVar2 = Vec_IntEntry(vEntries, 2*k+1);

            vCube1 = Vec_WecEntry(&p->vCubeLits, iCube1);
            vCube2 = Vec_WecEntry(&p->vCubeLits, iCube2);
/*
            Pla_PrintCube( vCube1, p->nIns, iVar1 );
            Pla_PrintCube( vCube2, p->nIns, iVar2 );
            printf( "\n" );
*/
            if ( Vec_IntSize(vCube1) != Vec_IntSize(vCube2) )
                continue;
            Vec_IntCopySkip( vCube1, iVar1, vTemp1 );
            Vec_IntCopySkip( vCube2, iVar2, vTemp2 );
            if ( !Vec_IntEqual( vTemp1, vTemp2 ) )
                continue;

            printf( "%d %d  ", iCube1, iCube2 );

            Vec_IntPushTwo( vPairs, iCube1, iVar1 );
            Vec_IntPushTwo( vPairs, iCube2, iVar2 );

            Vec_IntAddToEntry( vCounts, iCube1, 1 );
            Vec_IntAddToEntry( vCounts, iCube2, 1 );
        }
    }
    Vec_IntPrint( vCounts );

    Vec_IntFree( vCounts );
    Vec_IntFree( vTemp1 );
    Vec_IntFree( vTemp2 );
    Vec_IntFree( vEntries );
    Tab_ManFree( pTab );
    return vPairs;
}